

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::initializer_list<const_char_*>_&>::
DescribeNegationTo(ElementsAreMatcherImpl<const_std::initializer_list<const_char_*>_&> *this,
                  ostream *os)

{
  size_t sVar1;
  ostream *poVar2;
  MatcherBase<const_char_*const_&> *this_00;
  ulong local_38;
  size_t i;
  ostream *local_18;
  ostream *os_local;
  ElementsAreMatcherImpl<const_std::initializer_list<const_char_*>_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  sVar1 = count(this);
  if (sVar1 == 0) {
    std::operator<<(local_18,"isn\'t empty");
  }
  else {
    poVar2 = std::operator<<(local_18,"doesn\'t have ");
    sVar1 = count(this);
    Elements((ElementsAreMatcherImpl<const_std::initializer_list<const_char_*>_&> *)
             &stack0xffffffffffffffe0,sVar1);
    poVar2 = testing::operator<<(poVar2,(Message *)&stack0xffffffffffffffe0);
    std::operator<<(poVar2,", or\n");
    Message::~Message((Message *)&stack0xffffffffffffffe0);
    local_38 = 0;
    while( true ) {
      sVar1 = count(this);
      if (local_38 == sVar1) break;
      poVar2 = std::operator<<(local_18,"element #");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
      std::operator<<(poVar2," ");
      this_00 = &std::
                 vector<testing::Matcher<const_char_*const_&>,_std::allocator<testing::Matcher<const_char_*const_&>_>_>
                 ::operator[](&this->matchers_,local_38)->super_MatcherBase<const_char_*const_&>;
      MatcherBase<const_char_*const_&>::DescribeNegationTo(this_00,local_18);
      sVar1 = count(this);
      if (local_38 + 1 < sVar1) {
        std::operator<<(local_18,", or\n");
      }
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "isn't empty";
      return;
    }

    *os << "doesn't have " << Elements(count()) << ", or\n";
    for (size_t i = 0; i != count(); ++i) {
      *os << "element #" << i << " ";
      matchers_[i].DescribeNegationTo(os);
      if (i + 1 < count()) {
        *os << ", or\n";
      }
    }
  }